

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

string * __thiscall
Parameter<unsigned_long>::getParamType_abi_cxx11_(Parameter<unsigned_long> *this)

{
  string *in_RDI;
  
  ParameterTraits<unsigned_long>::getParamType_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }